

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void TPZFMatrix<long_double>::MultAdd
               (longdouble *ptr,int64_t rows,int64_t cols,TPZFMatrix<long_double> *x,
               TPZFMatrix<long_double> *y,TPZFMatrix<long_double> *z,longdouble alpha,
               longdouble beta,int opt)

{
  longdouble lVar1;
  bool bVar2;
  ulong uVar3;
  longdouble *plVar4;
  longdouble *plVar5;
  longdouble *plVar6;
  size_t sVar7;
  int64_t col;
  longdouble *plVar8;
  size_t __n;
  char *msg1;
  long lVar9;
  int64_t c;
  long lVar10;
  int64_t i;
  ulong row;
  long lVar11;
  long lVar12;
  longdouble lVar13;
  
  lVar11 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  msg1 = "TPZFMatrix::MultAdd matrix x with incompatible dimensions>";
  if (opt == 0) {
    if (lVar11 == cols) {
      lVar13 = (longdouble)0;
      bVar2 = beta != lVar13;
      if (((beta == lVar13) && (!NAN(beta) && !NAN(lVar13))) ||
         ((msg1 = "TPZFMatrix::MultAdd matrix y with incompatible dimensions>",
          (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow == rows &&
          ((y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol ==
           (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol)))) {
        uVar3 = rows;
        if (((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol !=
             (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol) ||
           ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow != rows)) {
          (*(z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xe])(z);
        }
        goto LAB_00cb150f;
      }
    }
  }
  else if (lVar11 == rows) {
    if ((beta != (longdouble)0) || (NAN(beta) || NAN((longdouble)0))) {
      msg1 = "TPZFMatrix::MultAdd matrix y with incompatible dimensions>";
      if (((y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow != cols) ||
         (bVar2 = true,
         (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol !=
         (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol)) goto LAB_00cb14cf;
    }
    else {
      bVar2 = false;
    }
    uVar3 = cols;
    if (((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol !=
         (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol) ||
       ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow != cols)) {
      (*(z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe]
      )(z);
    }
LAB_00cb150f:
    if (cols * rows != 0) {
      lVar11 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
      __n = (uVar3 & 0xffffffff) << 4;
      col = 0;
      if (lVar11 < 1) {
        lVar11 = col;
      }
      for (; col != lVar11; col = col + 1) {
        plVar4 = operator()(z,0,col);
        if (bVar2) {
          if (z != y) {
            memcpy(plVar4,y->fElem +
                          (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * col,__n);
          }
          for (row = 0; row != (uVar3 & 0xffffffff); row = row + 1) {
            for (lVar10 = 0; lVar11 != lVar10; lVar10 = lVar10 + 1) {
              plVar4 = operator()(z,row,lVar10);
              *plVar4 = beta * *plVar4;
            }
          }
        }
        else {
          for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 0x10) {
            *(longdouble *)((long)plVar4 + sVar7) = (longdouble)0;
          }
        }
      }
      lVar10 = 0;
      if (cols < 1) {
        cols = lVar10;
      }
      for (; lVar10 != lVar11; lVar10 = lVar10 + 1) {
        if (opt == 0) {
          for (lVar12 = 0; lVar12 != cols; lVar12 = lVar12 + 1) {
            plVar6 = operator()(z,0,lVar10);
            plVar5 = plVar6 + rows;
            lVar9 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
            plVar4 = x->fElem;
            plVar8 = ptr + lVar12 * rows;
            for (; plVar6 < plVar5; plVar6 = plVar6 + 1) {
              lVar13 = *plVar8;
              plVar8 = plVar8 + 1;
              *plVar6 = *plVar6 + plVar4[lVar9 * lVar10 + lVar12] * lVar13 * alpha;
            }
          }
        }
        else {
          plVar5 = operator()(z,0,lVar10);
          lVar12 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
          plVar4 = x->fElem;
          plVar6 = ptr;
          for (lVar9 = 0; lVar9 != cols; lVar9 = lVar9 + 1) {
            lVar13 = (longdouble)0;
            for (plVar8 = plVar4 + lVar12 * lVar10; plVar8 < plVar4 + lVar12 * lVar10 + rows;
                plVar8 = plVar8 + 1) {
              lVar1 = *plVar6;
              plVar6 = plVar6 + 1;
              lVar13 = *plVar8 * lVar1 + lVar13;
            }
            *plVar5 = lVar13 * alpha + *plVar5;
            plVar5 = plVar5 + 1;
          }
        }
      }
    }
    return;
  }
LAB_00cb14cf:
  Error(msg1,(char *)0x0);
  return;
}

Assistant:

void TPZFMatrix<TVar>::MultAdd(const TVar *ptr, int64_t rows, int64_t cols, const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                               const TVar alpha,const TVar beta ,const int opt)
{
    
    
    if ((!opt && cols != x.Rows()) || (opt && rows != x.Rows())) {
        Error( "TPZFMatrix::MultAdd matrix x with incompatible dimensions>" );
        return;
    }
    if(beta != (TVar)0. && ((!opt && rows != y.Rows()) || (opt && cols != y.Rows()) || y.Cols() != x.Cols())) {
        Error( "TPZFMatrix::MultAdd matrix y with incompatible dimensions>" );
        return;
    }
    if(!opt) {
        if(z.Cols() != x.Cols() || z.Rows() != rows) {
            z.Redim(rows,x.Cols());
        }
    } else {
        if(z.Cols() != x.Cols() || z.Rows() != cols) {
            z.Redim(cols,x.Cols());
        }
    }
    unsigned numeq = opt ? cols : rows;
    int64_t xcols = x.Cols();
    int64_t ic, c;
    if(!(rows*cols)) return;
    for (ic = 0; ic < xcols; ic++) {
        TVar *zp = &z(0,ic), *zlast = zp+numeq;
        if(beta != (TVar)0.) {
            const TVar *yp = &y.g(0,ic);
            if(&z != &y) {
                memcpy((void *)zp,(void *)yp,numeq*sizeof(TVar));
            }
            for(int64_t i=0; i< numeq; i++) for(int64_t c=0; c<xcols; c++) z(i,c) *= beta;
        } else {
            while(zp != zlast) {
                *zp = 0.;
                zp ++;
            }
        }
    }
    
    
    for (ic = 0; ic < xcols; ic++) {
        if(!opt) {
            for ( c = 0; c<cols; c++) {
                TVar * zp = &z(0,ic), *zlast = zp+rows;
                const TVar * fp = ptr +rows*c;
                const TVar * xp = &x.g(c,ic);
                while(zp < zlast) {
                    *zp += alpha* *fp++ * *xp;
                    zp ++;
                }
            }
        } else {
            const TVar * fp = ptr;
            TVar *zp = &z(0,ic);
            for (c = 0; c<cols; c++) {
                TVar val = 0.;
                // bug correction philippe 5/2/97
                //					 REAL * xp = &x(0,ic), xlast = xp + numeq;
                const TVar *xp = &x.g(0,ic);
                const TVar *xlast = xp + rows;
                while(xp < xlast) {
                    val += *fp++ * *xp;
                    xp ++;
                }
                *zp += alpha *val;
                zp ++;
            }
        }
    }
    
    
    
    
    
}